

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::updateHandle
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  ushort edge;
  ushort edge_00;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  Edge *pEVar5;
  int iVar6;
  undefined6 in_register_00000032;
  int iVar7;
  int axis;
  int axis_00;
  long lVar8;
  unsigned_short max [3];
  unsigned_short min [3];
  unsigned_short local_4c [6];
  Edge **local_40;
  long local_38;
  
  local_38 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
             ((ulong)(uint)((int)CONCAT62(in_register_00000032,handle) * 0x50) - 0x1c);
  lVar8 = 0;
  quantize(this,local_4c + 3,aabbMin,0);
  quantize(this,local_4c,aabbMax,1);
  local_40 = this->m_pEdges;
  do {
    edge = *(ushort *)(local_38 + 0x3c + lVar8 * 2);
    edge_00 = *(ushort *)(local_38 + 0x42 + lVar8 * 2);
    uVar1 = local_4c[lVar8 + 3];
    pEVar5 = local_40[lVar8];
    uVar2 = pEVar5[edge].m_pos;
    uVar3 = local_4c[lVar8];
    uVar4 = pEVar5[edge_00].m_pos;
    pEVar5[edge].m_pos = uVar1;
    iVar7 = (uint)uVar1 - (uint)uVar2;
    pEVar5[edge_00].m_pos = local_4c[lVar8];
    axis_00 = (int)lVar8;
    if (iVar7 < 0) {
      sortMinDown(this,axis_00,edge,dispatcher,true);
    }
    iVar6 = (uint)uVar3 - (uint)uVar4;
    if (0 < iVar6) {
      sortMaxUp(this,axis_00,edge_00,dispatcher,true);
    }
    if (0 < iVar7) {
      sortMinUp(this,axis_00,edge,dispatcher,true);
    }
    if (iVar6 < 0) {
      sortMaxDown(this,axis_00,edge_00,dispatcher,true);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}